

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_io.c
# Opt level: O2

size_t duckdb_je_malloc_vsnprintf(char *str,size_t size,char *format,__va_list_tag *ap)

{
  byte *pbVar1;
  undefined1 uVar2;
  void *pvVar3;
  char cVar4;
  char cVar5;
  emitter_t *peVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  uintmax_t uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  size_t sVar14;
  long lVar15;
  char *pcVar16;
  tsd_t *ptVar17;
  tsd_t *ptVar18;
  size_t extraout_RAX;
  byte bVar19;
  byte bVar20;
  undefined8 *puVar21;
  uintmax_t *puVar22;
  uint *puVar23;
  uint uVar24;
  ulong uVar25;
  uintmax_t x;
  size_t ***value;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  undefined1 uStack_1e1;
  undefined1 auStack_1e0 [12];
  undefined1 auStack_1d4 [4];
  char *pcStack_1d0;
  size_t sStack_1c8;
  undefined1 uStack_1b9;
  size_t asStack_1b8 [3];
  undefined1 auStack_1a0 [8];
  emitter_t *peStack_198;
  size_t asStack_190 [2];
  fxp_t fStack_17c;
  size_t sStack_178;
  uint uStack_170;
  uint uStack_16c;
  size_t **ppsStack_168;
  size_t **appsStack_160 [2];
  ulong uStack_150;
  undefined1 auStack_120 [12];
  undefined1 auStack_114 [4];
  size_t asStack_110 [2];
  undefined1 auStack_100 [8];
  ulong uStack_f8;
  size_t sStack_f0;
  size_t sStack_e8;
  byte *pbStack_e0;
  ulong uStack_d8;
  long lStack_d0;
  byte *pbStack_c8;
  ulong uStack_c0;
  byte local_b5;
  uint local_b4;
  emitter_t *local_b0;
  byte *local_a8;
  size_t slen;
  uint local_94;
  __va_list_tag *local_90;
  uintmax_t local_88;
  uint local_7c;
  char buf [66];
  
  uVar27 = 0;
  local_b0 = (emitter_t *)str;
  local_90 = ap;
LAB_0120d973:
  bVar19 = *format;
  if (bVar19 == 0x25) {
    uVar8 = 0;
    local_94 = 0;
    local_b4 = 0;
    lVar28 = 0;
LAB_0120d9ab:
    lVar15 = lVar28;
    local_a8 = (byte *)format + 1;
switchD_0120d9d7_caseD_23:
    format = (char *)local_a8;
    lVar28 = lVar15;
    bVar19 = *format;
    local_a8 = (byte *)format + 1;
    lVar15 = 1;
    switch(bVar19) {
    case 0x20:
      local_94 = 1;
      goto LAB_0120d9ab;
    default:
      goto switchD_0120d9d7_caseD_21;
    case 0x23:
      goto switchD_0120d9d7_caseD_23;
    case 0x2a:
      uVar26 = local_90->gp_offset;
      if ((ulong)uVar26 < 0x29) {
        puVar23 = (uint *)((ulong)uVar26 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar26 + 8;
      }
      else {
        puVar23 = (uint *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar23 + 2;
      }
      uVar26 = *puVar23;
      uVar24 = -uVar26;
      if (0 < (int)uVar26) {
        uVar24 = uVar26;
      }
      local_88 = (uintmax_t)uVar24;
      if ((int)uVar26 < 0) {
        local_b4 = 1;
      }
      bVar20 = 0x20;
      goto LAB_0120da24;
    case 0x2b:
      uVar8 = 1;
      goto LAB_0120d9ab;
    case 0x2d:
      goto switchD_0120d9d7_caseD_2d;
    case 0x30:
      bVar20 = bVar19;
      break;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      bVar20 = 0x20;
    }
    uStack_c0 = 0x120da01;
    local_a8 = (byte *)format;
    piVar10 = __errno_location();
    *piVar10 = 0;
    uStack_c0 = 0x120da17;
    local_88 = duckdb_je_malloc_strtoumax(format,(char **)&local_a8,10);
    str = (char *)local_b0;
LAB_0120da24:
    bVar19 = *local_a8;
    goto LAB_0120da29;
  }
  if (bVar19 == 0) {
    pcVar16 = (char *)((long)str + (size - 1));
    if (uVar27 < size) {
      pcVar16 = (char *)((long)&((emitter_t *)str)->output + uVar27);
    }
    *pcVar16 = '\0';
    return uVar27;
  }
  if (uVar27 < size) {
    *(byte *)((long)&((emitter_t *)str)->output + uVar27) = bVar19;
  }
  goto LAB_0120d98d;
switchD_0120d9d7_caseD_2d:
  local_b4 = 1;
  goto LAB_0120d9ab;
switchD_0120d9d7_caseD_21:
  bVar20 = 0x20;
  local_88 = 0xffffffff;
  local_a8 = (byte *)format;
LAB_0120da29:
  local_b5 = bVar20;
  local_7c = uVar8;
  if (bVar19 == 0x2e) {
    pbVar1 = local_a8 + 1;
    bVar19 = local_a8[1];
    if (bVar19 - 0x30 < 10) {
      uStack_c0 = 0x120da5e;
      local_a8 = pbVar1;
      piVar10 = __errno_location();
      *piVar10 = 0;
      uStack_c0 = 0x120da71;
      uVar11 = duckdb_je_malloc_strtoumax((char *)pbVar1,(char **)&local_a8,10);
      uVar8 = (uint)uVar11;
      str = (char *)local_b0;
      goto LAB_0120da85;
    }
    uVar8 = 0xffffffff;
    if (bVar19 == 0x2a) {
      uVar8 = local_90->gp_offset;
      if ((ulong)uVar8 < 0x29) {
        puVar23 = (uint *)((ulong)uVar8 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar8 + 8;
      }
      else {
        puVar23 = (uint *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar23 + 2;
      }
      uVar8 = *puVar23;
      local_a8 = local_a8 + 2;
      goto LAB_0120da85;
    }
  }
  else {
    uVar8 = 0xffffffff;
LAB_0120da85:
    bVar19 = *local_a8;
    pbVar1 = local_a8;
  }
  local_a8 = pbVar1;
  uVar26 = (uint)local_88;
  uVar24 = bVar19 - 0x6a;
  if (uVar24 < 0x11) {
    if ((0x10481U >> (uVar24 & 0x1f) & 1) != 0) {
      local_a8 = local_a8 + 1;
      goto LAB_0120dab0;
    }
    if (uVar24 != 2) goto LAB_0120dc0f;
    bVar20 = local_a8[1];
    bVar19 = 0x6c;
    pbStack_e0 = local_a8;
    pbVar1 = local_a8 + 1;
    if (bVar20 == 0x6c) {
      local_a8 = local_a8 + 2;
      bVar19 = 0x71;
      goto LAB_0120dab0;
    }
  }
  else {
LAB_0120dc0f:
    bVar19 = 0x3f;
LAB_0120dab0:
    bVar20 = *local_a8;
    pbStack_e0 = local_a8;
    pbVar1 = local_a8;
  }
  local_a8 = pbVar1;
  format = (char *)local_a8;
  uVar25 = (ulong)(int)uVar26;
  switch(bVar20) {
  case 0x6f:
    bVar19 = bVar19 | 0x80;
    uVar8 = local_90->gp_offset;
    uVar12 = (ulong)uVar8;
    if (bVar19 == 0xfa) {
      if (uVar8 < 0x29) {
        pvVar3 = local_90->reg_save_area;
LAB_0120e2a0:
        puVar22 = (uintmax_t *)((long)pvVar3 + uVar12);
        local_90->gp_offset = uVar8 + 8;
      }
      else {
LAB_0120e2a7:
        puVar22 = (uintmax_t *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar22 + 1;
      }
LAB_0120e2b3:
      uVar11 = *puVar22;
    }
    else {
      if (bVar19 == 0xea) {
LAB_0120db0b:
        if (0x28 < uVar8) goto LAB_0120e2a7;
        puVar22 = (uintmax_t *)((long)local_90->reg_save_area + uVar12);
        local_90->gp_offset = uVar8 + 8;
        goto LAB_0120e2b3;
      }
      if (bVar19 == 0xec) {
        if (uVar8 < 0x29) {
          pvVar3 = local_90->reg_save_area;
          goto LAB_0120e2a0;
        }
        goto LAB_0120e2a7;
      }
      if (bVar19 == 0xf1) goto LAB_0120db0b;
      if (uVar8 < 0x29) {
        puVar23 = (uint *)(uVar12 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar8 + 8;
      }
      else {
        puVar23 = (uint *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar23 + 2;
      }
      uVar11 = (uintmax_t)*puVar23;
    }
    uStack_c0 = 0x120e2ca;
    pcVar16 = u2s(uVar11,8,false,buf,&slen);
    if ((lVar28 != 0) && (*pcVar16 != '0')) {
      slen = slen + 1;
      pcVar16[-1] = '0';
      pcVar16 = pcVar16 + -1;
    }
    sVar7 = slen;
    if ((int)local_88 == -1) {
      bVar29 = false;
      lVar28 = 0;
    }
    else {
      lVar28 = 0;
      if (slen <= uVar25) {
        lVar28 = uVar25 - slen;
      }
      bVar29 = slen <= uVar25 && uVar25 - slen != 0;
      if (((local_b4 & 1) == 0) && (lVar15 = lVar28, slen < uVar25)) {
        while (lVar15 != 0) {
          if (uVar27 < size) {
            *(byte *)((long)&local_b0->output + uVar27) = local_b5;
          }
          uVar27 = uVar27 + 1;
          lVar15 = lVar15 + -1;
        }
        bVar29 = true;
      }
    }
    uVar25 = size - uVar27;
    if (uVar27 <= size && uVar25 != 0) {
      if (slen < uVar25) {
        uVar25 = slen;
      }
      uStack_c0 = 0x120e370;
      switchD_016b45db::default((char *)((long)&local_b0->output + uVar27),pcVar16,uVar25);
    }
    uVar27 = sVar7 + uVar27;
    if (((byte)local_b4 & bVar29) != 0) {
      while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
        if (uVar27 < size) {
          *(char *)((long)&local_b0->output + uVar27) = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    goto LAB_0120e39f;
  case 0x70:
    uVar8 = local_90->gp_offset;
    if ((ulong)uVar8 < 0x29) {
      puVar22 = (uintmax_t *)((ulong)uVar8 + (long)local_90->reg_save_area);
      local_90->gp_offset = uVar8 + 8;
    }
    else {
      puVar22 = (uintmax_t *)local_90->overflow_arg_area;
      local_90->overflow_arg_area = puVar22 + 1;
    }
    uStack_c0 = 0x120de46;
    pcVar16 = x2s(*puVar22,true,false,buf,&slen);
    sVar7 = slen;
    if ((int)local_88 == -1) {
      bVar29 = false;
      lVar28 = 0;
    }
    else {
      lVar28 = 0;
      if (slen <= uVar25) {
        lVar28 = uVar25 - slen;
      }
      bVar29 = slen <= uVar25 && uVar25 - slen != 0;
      if (((local_b4 & 1) == 0) && (lVar15 = lVar28, slen < uVar25)) {
        while (lVar15 != 0) {
          if (uVar27 < size) {
            *(byte *)((long)&local_b0->output + uVar27) = local_b5;
          }
          uVar27 = uVar27 + 1;
          lVar15 = lVar15 + -1;
        }
        bVar29 = true;
      }
    }
    uVar25 = size - uVar27;
    if (uVar27 <= size && uVar25 != 0) {
      if (slen < uVar25) {
        uVar25 = slen;
      }
      uStack_c0 = 0x120e0e1;
      switchD_016b45db::default((char *)((long)&local_b0->output + uVar27),pcVar16,uVar25);
    }
    uVar27 = sVar7 + uVar27;
    if (((byte)local_b4 & bVar29) != 0) {
      while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
        if (uVar27 < size) {
          *(char *)((long)&local_b0->output + uVar27) = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    goto LAB_0120e39f;
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto stats_general_print;
  case 0x73:
    uVar24 = local_90->gp_offset;
    if ((ulong)uVar24 < 0x29) {
      puVar21 = (undefined8 *)((ulong)uVar24 + (long)local_90->reg_save_area);
      local_90->gp_offset = uVar24 + 8;
    }
    else {
      puVar21 = (undefined8 *)local_90->overflow_arg_area;
      local_90->overflow_arg_area = puVar21 + 1;
    }
    pcVar16 = (char *)*puVar21;
    if ((int)uVar8 < 0) {
      uStack_c0 = 0x120e003;
      sVar14 = strlen(pcVar16);
      uVar26 = (uint)local_88;
      str = (char *)local_b0;
    }
    else {
      sVar14 = (size_t)uVar8;
    }
    lVar28 = uVar25 - sVar14;
    if (uVar25 < sVar14) {
      lVar28 = 0;
    }
    if (uVar26 == 0xffffffff) {
      lVar28 = 0;
    }
    if (((local_b4 & 1) == 0) && (lVar15 = lVar28, lVar28 != 0)) {
      while (lVar15 != 0) {
        if (uVar27 < size) {
          *(byte *)((long)&((emitter_t *)str)->output + uVar27) = local_b5;
        }
        uVar27 = uVar27 + 1;
        lVar15 = lVar15 + -1;
      }
    }
    uVar25 = size - uVar27;
    slen = sVar14;
    if (uVar27 <= size && uVar25 != 0) {
      if (sVar14 < uVar25) {
        uVar25 = sVar14;
      }
      uStack_c0 = 0x120e070;
      switchD_016b45db::default((char *)((long)&local_b0->output + uVar27),pcVar16,uVar25);
      str = (char *)local_b0;
    }
    uVar27 = uVar27 + sVar14;
    if (((local_b4 & 1) != 0) && (lVar28 != 0)) {
      while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
        if (uVar27 < size) {
          *(char *)((long)&((emitter_t *)str)->output + uVar27) = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    goto LAB_0120d990;
  case 0x75:
    bVar19 = bVar19 | 0x80;
    uVar8 = local_90->gp_offset;
    uVar12 = (ulong)uVar8;
    if (bVar19 == 0xfa) {
      if (0x28 < uVar8) goto LAB_0120e3d5;
      pvVar3 = local_90->reg_save_area;
LAB_0120e3ce:
      puVar22 = (uintmax_t *)((long)pvVar3 + uVar12);
      local_90->gp_offset = uVar8 + 8;
    }
    else {
      if (bVar19 != 0xea) {
        if (bVar19 == 0xec) {
          if (uVar8 < 0x29) {
            pvVar3 = local_90->reg_save_area;
            goto LAB_0120e3ce;
          }
          goto LAB_0120e3d5;
        }
        if (bVar19 != 0xf1) {
          if (uVar8 < 0x29) {
            puVar23 = (uint *)(uVar12 + (long)local_90->reg_save_area);
            local_90->gp_offset = uVar8 + 8;
          }
          else {
            puVar23 = (uint *)local_90->overflow_arg_area;
            local_90->overflow_arg_area = puVar23 + 2;
          }
          uVar11 = (uintmax_t)*puVar23;
          goto LAB_0120e3e4;
        }
      }
      if (uVar8 < 0x29) {
        puVar22 = (uintmax_t *)((long)local_90->reg_save_area + uVar12);
        local_90->gp_offset = uVar8 + 8;
      }
      else {
LAB_0120e3d5:
        puVar22 = (uintmax_t *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar22 + 1;
      }
    }
    uVar11 = *puVar22;
LAB_0120e3e4:
    uStack_c0 = 0x120e3f8;
    pcVar16 = u2s(uVar11,10,false,buf,&slen);
    sVar7 = slen;
    if ((int)local_88 == -1) {
      bVar29 = false;
      lVar28 = 0;
    }
    else {
      lVar28 = 0;
      if (slen <= uVar25) {
        lVar28 = uVar25 - slen;
      }
      bVar29 = slen <= uVar25 && uVar25 - slen != 0;
      if (((local_b4 & 1) == 0) && (lVar15 = lVar28, slen < uVar25)) {
        while (lVar15 != 0) {
          if (uVar27 < size) {
            *(byte *)((long)&local_b0->output + uVar27) = local_b5;
          }
          uVar27 = uVar27 + 1;
          lVar15 = lVar15 + -1;
        }
        bVar29 = true;
      }
    }
    uVar25 = size - uVar27;
    if (uVar27 <= size && uVar25 != 0) {
      if (slen < uVar25) {
        uVar25 = slen;
      }
      uStack_c0 = 0x120e47c;
      switchD_016b45db::default((char *)((long)&local_b0->output + uVar27),pcVar16,uVar25);
    }
    uVar27 = sVar7 + uVar27;
    if (((byte)local_b4 & bVar29) != 0) {
      while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
        if (uVar27 < size) {
          *(char *)((long)&local_b0->output + uVar27) = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    format = (char *)((byte *)format + 1);
    str = (char *)local_b0;
    goto LAB_0120d973;
  case 0x78:
switchD_0120dad3_caseD_78:
    bVar19 = bVar19 | 0x80;
    uVar8 = local_90->gp_offset;
    uVar12 = (ulong)uVar8;
    if (bVar19 == 0xfa) {
      if (uVar8 < 0x29) {
        pvVar3 = local_90->reg_save_area;
LAB_0120def4:
        puVar22 = (uintmax_t *)((long)pvVar3 + uVar12);
        local_90->gp_offset = uVar8 + 8;
      }
      else {
LAB_0120defb:
        puVar22 = (uintmax_t *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar22 + 1;
      }
LAB_0120df07:
      uVar11 = *puVar22;
    }
    else {
      if (bVar19 == 0xea) {
LAB_0120dbf5:
        if (0x28 < uVar8) goto LAB_0120defb;
        puVar22 = (uintmax_t *)((long)local_90->reg_save_area + uVar12);
        local_90->gp_offset = uVar8 + 8;
        goto LAB_0120df07;
      }
      if (bVar19 == 0xec) {
        if (uVar8 < 0x29) {
          pvVar3 = local_90->reg_save_area;
          goto LAB_0120def4;
        }
        goto LAB_0120defb;
      }
      if (bVar19 == 0xf1) goto LAB_0120dbf5;
      if (uVar8 < 0x29) {
        puVar23 = (uint *)(uVar12 + (long)local_90->reg_save_area);
        local_90->gp_offset = uVar8 + 8;
      }
      else {
        puVar23 = (uint *)local_90->overflow_arg_area;
        local_90->overflow_arg_area = puVar23 + 2;
      }
      uVar11 = (uintmax_t)*puVar23;
    }
    uStack_c0 = 0x120df29;
    pcVar16 = x2s(uVar11,SUB81(lVar28,0),*local_a8 == 0x58,buf,&slen);
    sVar7 = slen;
    if ((int)local_88 == -1) {
      bVar29 = false;
      lVar28 = 0;
    }
    else {
      lVar28 = 0;
      if (slen <= uVar25) {
        lVar28 = uVar25 - slen;
      }
      bVar29 = slen <= uVar25 && uVar25 - slen != 0;
      if (((local_b4 & 1) == 0) && (lVar15 = lVar28, slen < uVar25)) {
        while (lVar15 != 0) {
          if (uVar27 < size) {
            *(byte *)((long)&local_b0->output + uVar27) = local_b5;
          }
          uVar27 = uVar27 + 1;
          lVar15 = lVar15 + -1;
        }
        bVar29 = true;
      }
    }
    uVar25 = size - uVar27;
    if (uVar27 <= size && uVar25 != 0) {
      if (slen < uVar25) {
        uVar25 = slen;
      }
      uStack_c0 = 0x120dfaa;
      switchD_016b45db::default((char *)((long)&local_b0->output + uVar27),pcVar16,uVar25);
    }
    uVar27 = sVar7 + uVar27;
    if (((byte)local_b4 & bVar29) != 0) {
      while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
        if (uVar27 < size) {
          *(char *)((long)&local_b0->output + uVar27) = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    goto LAB_0120e39f;
  default:
    if (bVar20 != 0x69) {
      if (bVar20 == 0x58) goto switchD_0120dad3_caseD_78;
      if (bVar20 == 99) {
        uVar8 = local_90->gp_offset;
        if ((ulong)uVar8 < 0x29) {
          puVar13 = (undefined1 *)((ulong)uVar8 + (long)local_90->reg_save_area);
          local_90->gp_offset = uVar8 + 8;
        }
        else {
          puVar13 = (undefined1 *)local_90->overflow_arg_area;
          local_90->overflow_arg_area = puVar13 + 8;
        }
        uVar2 = *puVar13;
        lVar28 = uVar25 - 1;
        if (uVar26 < 2) {
          lVar28 = 0;
        }
        if (uVar26 == 0xffffffff) {
          lVar28 = 0;
        }
        if (((local_b4 & 1) == 0) && (lVar15 = lVar28, lVar28 != 0)) {
          while (lVar15 != 0) {
            if (uVar27 < size) {
              *(byte *)((long)&((emitter_t *)str)->output + uVar27) = local_b5;
            }
            uVar27 = uVar27 + 1;
            lVar15 = lVar15 + -1;
          }
        }
        if (uVar27 < size) {
          *(undefined1 *)((long)&((emitter_t *)str)->output + uVar27) = uVar2;
        }
        uVar27 = uVar27 + 1;
        if (((local_b4 & 1) != 0) && (lVar28 != 0)) {
          while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
            if (uVar27 < size) {
              *(undefined1 *)((long)&((emitter_t *)str)->output + uVar27) = 0x20;
            }
            uVar27 = uVar27 + 1;
          }
        }
LAB_0120d990:
        format = (char *)((byte *)format + 1);
        goto LAB_0120d973;
      }
      if (bVar20 != 100) {
        if (uVar27 < size) {
          *(undefined1 *)((long)&((emitter_t *)str)->output + uVar27) = 0x25;
        }
LAB_0120d98d:
        uVar27 = uVar27 + 1;
        goto LAB_0120d990;
      }
    }
  }
  uVar8 = local_90->gp_offset;
  uVar12 = (ulong)uVar8;
  switch(bVar19) {
  case 0x6a:
    if (uVar8 < 0x29) {
      puVar22 = (uintmax_t *)((long)local_90->reg_save_area + uVar12);
      local_90->gp_offset = uVar8 + 8;
    }
    else {
LAB_0120e143:
      puVar22 = (uintmax_t *)local_90->overflow_arg_area;
      local_90->overflow_arg_area = puVar22 + 1;
    }
    goto LAB_0120e14f;
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x72:
  case 0x73:
stats_general_print:
    sStack_1c8 = 1;
    asStack_190[1] = 4;
    asStack_1b8[0] = 8;
    asStack_190[0] = 8;
    asStack_1b8[1] = 8;
    sStack_f0 = 4;
    asStack_110[0] = 8;
    asStack_110[1] = 8;
    appsStack_160[0] = (size_t **)0x8;
    sStack_e8 = size;
    uStack_d8 = uVar27;
    lStack_d0 = lVar28;
    pbStack_c8 = local_a8;
    uStack_c0 = uVar25;
    iVar9 = duckdb_je_mallctl("version",&pcStack_1d0,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "version";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"version","Version",emitter_type_string,&pcStack_1d0);
    emitter_dict_begin((emitter_t *)str,"config","Build-time option settings");
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.cache_oblivious",&uStack_1e1,(size_t *)appsStack_160,
                              (void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.cache_oblivious";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"cache_oblivious","config.cache_oblivious",emitter_type_bool,
               &uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.debug",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.debug";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"debug","config.debug",emitter_type_bool,&uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.fill",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.fill";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"fill","config.fill",emitter_type_bool,&uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.lazy_lock",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.lazy_lock";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"lazy_lock","config.lazy_lock",emitter_type_bool,&uStack_1e1);
    emitter_kv((emitter_t *)str,"malloc_conf","config.malloc_conf",emitter_type_string,
               &config_malloc_conf);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.opt_safety_checks",&uStack_1e1,(size_t *)appsStack_160,
                              (void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.opt_safety_checks";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"opt_safety_checks","config.opt_safety_checks",emitter_type_bool,
               &uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.prof",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.prof";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"prof","config.prof",emitter_type_bool,&uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.prof_libgcc",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0
                             );
    if (iVar9 != 0) {
      pcVar16 = "config.prof_libgcc";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"prof_libgcc","config.prof_libgcc",emitter_type_bool,&uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.prof_libunwind",&uStack_1e1,(size_t *)appsStack_160,
                              (void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.prof_libunwind";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"prof_libunwind","config.prof_libunwind",emitter_type_bool,
               &uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.stats",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.stats";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"stats","config.stats",emitter_type_bool,&uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.utrace",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.utrace";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"utrace","config.utrace",emitter_type_bool,&uStack_1e1);
    appsStack_160[0] = (size_t **)0x1;
    iVar9 = duckdb_je_mallctl("config.xmalloc",&uStack_1e1,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "config.xmalloc";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"xmalloc","config.xmalloc",emitter_type_bool,&uStack_1e1);
    emitter_dict_end((emitter_t *)str);
    emitter_dict_begin((emitter_t *)str,"opt","Run-time option settings");
    iVar9 = duckdb_je_mallctl("opt.malloc_conf.global_var",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,
                              0);
    if (iVar9 != 0) {
      pcStack_1d0 = anon_var_dwarf_3b6586a + 9;
    }
    emitter_kv((emitter_t *)str,"global_var","Global variable malloc_conf",emitter_type_string,
               &pcStack_1d0);
    iVar9 = duckdb_je_mallctl("opt.malloc_conf.symlink",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 != 0) {
      pcStack_1d0 = anon_var_dwarf_3b6586a + 9;
    }
    emitter_kv((emitter_t *)str,"symlink","Symbolic link malloc.conf",emitter_type_string,
               &pcStack_1d0);
    iVar9 = duckdb_je_mallctl("opt.malloc_conf.env_var",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 != 0) {
      pcStack_1d0 = anon_var_dwarf_3b6586a + 9;
    }
    emitter_kv((emitter_t *)str,"env_var","Environment variable MALLOC_CONF",emitter_type_string,
               &pcStack_1d0);
    iVar9 = duckdb_je_mallctl("opt.malloc_conf.global_var_2_conf_harder",&pcStack_1d0,
                              asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"global_var_2_conf_harder",
                 "Global variable malloc_conf_2_conf_harder",emitter_type_string,&pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.abort",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"abort","opt.abort",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.abort_conf",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"abort_conf","opt.abort_conf",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.cache_oblivious",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"cache_oblivious","opt.cache_oblivious",emitter_type_bool,
                 &uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.confirm_conf",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"confirm_conf","opt.confirm_conf",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.retain",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"retain","opt.retain",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.dss",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"dss","opt.dss",emitter_type_string,&pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.narenas",auStack_1d4,asStack_190 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"narenas","opt.narenas",emitter_type_unsigned,auStack_1d4);
    }
    iVar9 = duckdb_je_mallctl("opt.percpu_arena",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"percpu_arena","opt.percpu_arena",emitter_type_string,&pcStack_1d0
                );
    }
    iVar9 = duckdb_je_mallctl("opt.oversize_threshold",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"oversize_threshold","opt.oversize_threshold",emitter_type_size,
                 auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa","opt.hpa",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_slab_max_alloc",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_slab_max_alloc","opt.hpa_slab_max_alloc",emitter_type_size,
                 auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_hugification_threshold",auStack_1e0,asStack_1b8,(void *)0x0,0
                             );
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_hugification_threshold","opt.hpa_hugification_threshold",
                 emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_hugify_delay_ms",auStack_120,asStack_110 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_hugify_delay_ms","opt.hpa_hugify_delay_ms",
                 emitter_type_uint64,auStack_120);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_min_purge_interval_ms",auStack_120,asStack_110 + 1,
                              (void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_min_purge_interval_ms","opt.hpa_min_purge_interval_ms",
                 emitter_type_uint64,auStack_120);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_strict_min_purge_interval",&uStack_1e1,&sStack_1c8,
                              (void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_strict_min_purge_interval",
                 "opt.hpa_strict_min_purge_interval",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_dirty_mult",&fStack_17c,&sStack_f0,(void *)0x0,0);
    if (iVar9 == 0) {
      if (fStack_17c == 0xffffffff) {
        value = appsStack_160;
        appsStack_160[0] = (size_t **)0x201af75;
      }
      else {
        duckdb_je_fxp_print(fStack_17c,(char *)appsStack_160);
        value = &ppsStack_168;
        ppsStack_168 = (size_t **)appsStack_160;
      }
      emitter_kv((emitter_t *)str,"hpa_dirty_mult","opt.hpa_dirty_mult",emitter_type_string,value);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_sec_nshards",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_sec_nshards","opt.hpa_sec_nshards",emitter_type_size,
                 auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_sec_max_alloc",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_sec_max_alloc","opt.hpa_sec_max_alloc",emitter_type_size,
                 auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_sec_max_bytes",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_sec_max_bytes","opt.hpa_sec_max_bytes",emitter_type_size,
                 auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_sec_bytes_after_flush",auStack_1e0,asStack_1b8,(void *)0x0,0)
    ;
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_sec_bytes_after_flush","opt.hpa_sec_bytes_after_flush",
                 emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.hpa_sec_batch_fill_extra",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"hpa_sec_batch_fill_extra","opt.hpa_sec_batch_fill_extra",
                 emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.metadata_thp",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"metadata_thp","opt.metadata_thp",emitter_type_string,&pcStack_1d0
                );
    }
    iVar9 = duckdb_je_mallctl("opt.mutex_max_spin",&ppsStack_168,asStack_110,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"mutex_max_spin","opt.mutex_max_spin",emitter_type_int64,
                 &ppsStack_168);
    }
    iVar9 = duckdb_je_mallctl("opt.background_thread",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      iVar9 = duckdb_je_mallctl("background_thread",&uStack_1b9,&sStack_1c8,(void *)0x0,0);
      if (iVar9 == 0) {
        emitter_kv_note((emitter_t *)str,"background_thread","opt.background_thread",
                        emitter_type_bool,&uStack_1e1,"background_thread",emitter_type_bool,
                        &uStack_1b9);
      }
    }
    iVar9 = duckdb_je_mallctl("opt.dirty_decay_ms",auStack_1a0,asStack_190,(void *)0x0,0);
    if (iVar9 == 0) {
      iVar9 = duckdb_je_mallctl("arenas.dirty_decay_ms",auStack_100,asStack_190,(void *)0x0,0);
      if (iVar9 == 0) {
        emitter_kv_note((emitter_t *)str,"dirty_decay_ms","opt.dirty_decay_ms",emitter_type_ssize,
                        auStack_1a0,"arenas.dirty_decay_ms",emitter_type_ssize,auStack_100);
      }
    }
    iVar9 = duckdb_je_mallctl("opt.muzzy_decay_ms",auStack_1a0,asStack_190,(void *)0x0,0);
    if (iVar9 == 0) {
      iVar9 = duckdb_je_mallctl("arenas.muzzy_decay_ms",auStack_100,asStack_190,(void *)0x0,0);
      if (iVar9 == 0) {
        emitter_kv_note((emitter_t *)str,"muzzy_decay_ms","opt.muzzy_decay_ms",emitter_type_ssize,
                        auStack_1a0,"arenas.muzzy_decay_ms",emitter_type_ssize,auStack_100);
      }
    }
    iVar9 = duckdb_je_mallctl("opt.lg_extent_max_active_fit",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"lg_extent_max_active_fit","opt.lg_extent_max_active_fit",
                 emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.junk",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"junk","opt.junk",emitter_type_string,&pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.zero",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"zero","opt.zero",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.utrace",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"utrace","opt.utrace",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.xmalloc",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"xmalloc","opt.xmalloc",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.experimental_infallible_new",&uStack_1e1,&sStack_1c8,(void *)0x0,
                              0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"experimental_infallible_new","opt.experimental_infallible_new",
                 emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.max_batched_size",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"max_batched_size","opt.max_batched_size",emitter_type_size,
                 auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.remote_free_max",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"remote_free_max","opt.remote_free_max",emitter_type_size,
                 auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.remote_free_max_batch",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"remote_free_max_batch","opt.remote_free_max_batch",
                 emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.tcache",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache","opt.tcache",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.tcache_max",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache_max","opt.tcache_max",emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.tcache_nslots_small_min",auStack_1d4,asStack_190 + 1,(void *)0x0,
                              0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache_nslots_small_min","opt.tcache_nslots_small_min",
                 emitter_type_unsigned,auStack_1d4);
    }
    iVar9 = duckdb_je_mallctl("opt.tcache_nslots_small_max",auStack_1d4,asStack_190 + 1,(void *)0x0,
                              0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache_nslots_small_max","opt.tcache_nslots_small_max",
                 emitter_type_unsigned,auStack_1d4);
    }
    iVar9 = duckdb_je_mallctl("opt.tcache_nslots_large",auStack_1d4,asStack_190 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache_nslots_large","opt.tcache_nslots_large",
                 emitter_type_unsigned,auStack_1d4);
    }
    iVar9 = duckdb_je_mallctl("opt.lg_tcache_nslots_mul",auStack_1a0,asStack_190,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"lg_tcache_nslots_mul","opt.lg_tcache_nslots_mul",
                 emitter_type_ssize,auStack_1a0);
    }
    iVar9 = duckdb_je_mallctl("opt.tcache_gc_incr_bytes",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache_gc_incr_bytes","opt.tcache_gc_incr_bytes",
                 emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.tcache_gc_delay_bytes",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache_gc_delay_bytes","opt.tcache_gc_delay_bytes",
                 emitter_type_size,auStack_1e0);
    }
    iVar9 = duckdb_je_mallctl("opt.lg_tcache_flush_small_div",auStack_1d4,asStack_190 + 1,
                              (void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"lg_tcache_flush_small_div","opt.lg_tcache_flush_small_div",
                 emitter_type_unsigned,auStack_1d4);
    }
    iVar9 = duckdb_je_mallctl("opt.lg_tcache_flush_large_div",auStack_1d4,asStack_190 + 1,
                              (void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"lg_tcache_flush_large_div","opt.lg_tcache_flush_large_div",
                 emitter_type_unsigned,auStack_1d4);
    }
    iVar9 = duckdb_je_mallctl("opt.debug_double_free_max_scan",auStack_1d4,asStack_190 + 1,
                              (void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"debug_double_free_max_scan","opt.debug_double_free_max_scan",
                 emitter_type_unsigned,auStack_1d4);
    }
    iVar9 = duckdb_je_mallctl("opt.thp",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"thp","opt.thp",emitter_type_string,&pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.prof",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof","opt.prof",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.prof_bt_max",auStack_1d4,asStack_190 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof_bt_max","opt.prof_bt_max",emitter_type_unsigned,auStack_1d4)
      ;
    }
    iVar9 = duckdb_je_mallctl("opt.prof_prefix",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof_prefix","opt.prof_prefix",emitter_type_string,&pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.prof_active",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      iVar9 = duckdb_je_mallctl("prof.active",&uStack_1b9,&sStack_1c8,(void *)0x0,0);
      if (iVar9 == 0) {
        emitter_kv_note((emitter_t *)str,"prof_active","opt.prof_active",emitter_type_bool,
                        &uStack_1e1,"prof.active",emitter_type_bool,&uStack_1b9);
      }
    }
    iVar9 = duckdb_je_mallctl("opt.prof_thread_active_init",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      iVar9 = duckdb_je_mallctl("prof.thread_active_init",&uStack_1b9,&sStack_1c8,(void *)0x0,0);
      if (iVar9 == 0) {
        emitter_kv_note((emitter_t *)str,"prof_thread_active_init","opt.prof_thread_active_init",
                        emitter_type_bool,&uStack_1e1,"prof.thread_active_init",emitter_type_bool,
                        &uStack_1b9);
      }
    }
    iVar9 = duckdb_je_mallctl("opt.lg_prof_sample",auStack_1a0,asStack_190,(void *)0x0,0);
    if (iVar9 == 0) {
      iVar9 = duckdb_je_mallctl("prof.lg_sample",auStack_100,asStack_190,(void *)0x0,0);
      if (iVar9 == 0) {
        emitter_kv_note((emitter_t *)str,"lg_prof_sample","opt.lg_prof_sample",emitter_type_ssize,
                        auStack_1a0,"prof.lg_sample",emitter_type_ssize,auStack_100);
      }
    }
    iVar9 = duckdb_je_mallctl("opt.prof_accum",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof_accum","opt.prof_accum",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.lg_prof_interval",auStack_1a0,asStack_190,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"lg_prof_interval","opt.lg_prof_interval",emitter_type_ssize,
                 auStack_1a0);
    }
    iVar9 = duckdb_je_mallctl("opt.prof_gdump",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof_gdump","opt.prof_gdump",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.prof_final",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof_final","opt.prof_final",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.prof_leak",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof_leak","opt.prof_leak",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.prof_leak_error",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"prof_leak_error","opt.prof_leak_error",emitter_type_bool,
                 &uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.stats_print",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"stats_print","opt.stats_print",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.stats_print_opts",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"stats_print_opts","opt.stats_print_opts",emitter_type_string,
                 &pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.stats_print",&uStack_1e1,&sStack_1c8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"stats_print","opt.stats_print",emitter_type_bool,&uStack_1e1);
    }
    iVar9 = duckdb_je_mallctl("opt.stats_print_opts",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"stats_print_opts","opt.stats_print_opts",emitter_type_string,
                 &pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.stats_interval",&ppsStack_168,asStack_110,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"stats_interval","opt.stats_interval",emitter_type_int64,
                 &ppsStack_168);
    }
    iVar9 = duckdb_je_mallctl("opt.stats_interval_opts",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"stats_interval_opts","opt.stats_interval_opts",
                 emitter_type_string,&pcStack_1d0);
    }
    iVar9 = duckdb_je_mallctl("opt.zero_realloc",&pcStack_1d0,asStack_1b8 + 1,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"zero_realloc","opt.zero_realloc",emitter_type_string,&pcStack_1d0
                );
    }
    emitter_dict_end((emitter_t *)str);
    emitter_json_object_kv_begin((emitter_t *)str,"arenas");
    appsStack_160[0] = (size_t **)0x4;
    iVar9 = duckdb_je_mallctl("arenas.narenas",auStack_1d4,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.narenas";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"narenas","Arenas",emitter_type_unsigned,auStack_1d4);
    appsStack_160[0] = (size_t **)0x8;
    iVar9 = duckdb_je_mallctl("arenas.dirty_decay_ms",auStack_1a0,(size_t *)appsStack_160,
                              (void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.dirty_decay_ms";
      goto LAB_012104b9;
    }
    emitter_json_kv((emitter_t *)str,"dirty_decay_ms",emitter_type_ssize,auStack_1a0);
    appsStack_160[0] = (size_t **)0x8;
    iVar9 = duckdb_je_mallctl("arenas.muzzy_decay_ms",auStack_1a0,(size_t *)appsStack_160,
                              (void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.muzzy_decay_ms";
      goto LAB_012104b9;
    }
    emitter_json_kv((emitter_t *)str,"muzzy_decay_ms",emitter_type_ssize,auStack_1a0);
    appsStack_160[0] = (size_t **)0x8;
    iVar9 = duckdb_je_mallctl("arenas.quantum",auStack_1e0,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.quantum";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"quantum","Quantum size",emitter_type_size,auStack_1e0);
    appsStack_160[0] = (size_t **)0x8;
    iVar9 = duckdb_je_mallctl("arenas.page",auStack_1e0,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.page";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"page","Page size",emitter_type_size,auStack_1e0);
    appsStack_160[0] = (size_t **)0x8;
    iVar9 = duckdb_je_mallctl("arenas.hugepage",auStack_1e0,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.hugepage";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"hugepage","Hugepage size",emitter_type_size,auStack_1e0);
    iVar9 = duckdb_je_mallctl("arenas.tcache_max",auStack_1e0,asStack_1b8,(void *)0x0,0);
    if (iVar9 == 0) {
      emitter_kv((emitter_t *)str,"tcache_max","Maximum thread-cached size class",emitter_type_size,
                 auStack_1e0);
    }
    appsStack_160[0] = (size_t **)0x4;
    iVar9 = duckdb_je_mallctl("arenas.nbins",&uStack_16c,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.nbins";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"nbins","Number of bin size classes",emitter_type_unsigned,
               &uStack_16c);
    appsStack_160[0] = (size_t **)0x4;
    iVar9 = duckdb_je_mallctl("arenas.nhbins",auStack_114,(size_t *)appsStack_160,(void *)0x0,0);
    if (iVar9 != 0) {
      pcVar16 = "arenas.nhbins";
      goto LAB_012104b9;
    }
    emitter_kv((emitter_t *)str,"nhbins","Number of thread-cache bin size classes",
               emitter_type_unsigned,auStack_114);
    peStack_198 = (emitter_t *)str;
    if (emitter_output_json_compact < ((emitter_t *)str)->output) goto LAB_01210168;
    emitter_json_array_kv_begin((emitter_t *)str,"bin");
    asStack_1b8[2] = 7;
    ptVar17 = (tsd_t *)__tls_get_addr(&PTR_027f6ac0);
    ptVar18 = ptVar17;
    if ((ptVar17->state).repr != '\0') {
      ptVar18 = duckdb_je_tsd_fetch_slow(ptVar17,false);
    }
    iVar9 = duckdb_je_ctl_mibnametomib
                      (ptVar18,(size_t *)appsStack_160,0,"arenas.bin",asStack_1b8 + 2);
    if (iVar9 != 0) goto LAB_0121049f;
    uVar27 = 0;
    goto LAB_0120ff00;
  case 0x6c:
  case 0x71:
  case 0x74:
switchD_0120db74_caseD_6c:
    if (0x28 < uVar8) goto LAB_0120e143;
    pvVar3 = local_90->reg_save_area;
    break;
  case 0x70:
    if (0x28 < uVar8) goto LAB_0120e143;
    pvVar3 = local_90->reg_save_area;
    break;
  default:
    if (bVar19 == 0x7a) goto switchD_0120db74_caseD_6c;
    if (uVar8 < 0x29) {
      piVar10 = (int *)(uVar12 + (long)local_90->reg_save_area);
      local_90->gp_offset = uVar8 + 8;
    }
    else {
      piVar10 = (int *)local_90->overflow_arg_area;
      local_90->overflow_arg_area = piVar10 + 2;
    }
    uVar11 = (uintmax_t)*piVar10;
    goto LAB_0120e152;
  }
  puVar22 = (uintmax_t *)((long)pvVar3 + uVar12);
  local_90->gp_offset = uVar8 + 8;
LAB_0120e14f:
  uVar11 = *puVar22;
LAB_0120e152:
  cVar4 = '-';
  cVar5 = '-';
  if ((local_94 & 1) != 0) {
    cVar5 = ' ';
  }
  if ((local_7c & 1) != 0) {
    cVar5 = '+';
  }
  x = -uVar11;
  if (0 < (long)uVar11) {
    x = uVar11;
  }
  uStack_c0 = 0x120e18d;
  pcVar16 = u2s(x,10,false,buf,&slen);
  if (((long)uVar11 < 0) || (cVar4 = cVar5, cVar5 != '-')) {
    slen = slen + 1;
    pcVar16[-1] = cVar4;
    pcVar16 = pcVar16 + -1;
  }
  sVar7 = slen;
  if ((int)local_88 == -1) {
    bVar29 = false;
    lVar28 = 0;
  }
  else {
    lVar28 = 0;
    if (slen <= uVar25) {
      lVar28 = uVar25 - slen;
    }
    bVar29 = slen <= uVar25 && uVar25 - slen != 0;
    if (((local_b4 & 1) == 0) && (lVar15 = lVar28, slen < uVar25)) {
      while (lVar15 != 0) {
        if (uVar27 < size) {
          *(byte *)((long)&local_b0->output + uVar27) = local_b5;
        }
        uVar27 = uVar27 + 1;
        lVar15 = lVar15 + -1;
      }
      bVar29 = true;
    }
  }
  uVar25 = size - uVar27;
  if (uVar27 <= size && uVar25 != 0) {
    if (slen < uVar25) {
      uVar25 = slen;
    }
    uStack_c0 = 0x120e227;
    switchD_016b45db::default((char *)((long)&local_b0->output + uVar27),pcVar16,uVar25);
  }
  uVar27 = sVar7 + uVar27;
  if (((byte)local_b4 & bVar29) != 0) {
    while (bVar29 = lVar28 != 0, lVar28 = lVar28 + -1, bVar29) {
      if (uVar27 < size) {
        *(char *)((long)&local_b0->output + uVar27) = ' ';
      }
      uVar27 = uVar27 + 1;
    }
  }
LAB_0120e39f:
  format = (char *)(local_a8 + 1);
  str = (char *)local_b0;
  goto LAB_0120d973;
LAB_0120ff00:
  str = (char *)peStack_198;
  if (uStack_16c <= uVar27) goto LAB_0121015b;
  uStack_150 = uVar27;
  uStack_f8 = uVar27;
  emitter_json_object_begin(peStack_198);
  asStack_1b8[2] = 7;
  sStack_178 = 8;
  ptVar18 = ptVar17;
  if ((ptVar17->state).repr != '\0') {
    ptVar18 = duckdb_je_tsd_fetch_slow(ptVar17,false);
  }
  iVar9 = duckdb_je_ctl_bymibname
                    (ptVar18,(size_t *)appsStack_160,3,"size",asStack_1b8 + 2,auStack_1e0,
                     &sStack_178,(void *)0x0,0);
  if (iVar9 != 0) goto LAB_01210327;
  emitter_json_kv(peStack_198,"size",emitter_type_size,auStack_1e0);
  asStack_1b8[2] = 7;
  sStack_178 = 4;
  ptVar18 = ptVar17;
  if ((ptVar17->state).repr != '\0') {
    ptVar18 = duckdb_je_tsd_fetch_slow(ptVar17,false);
  }
  iVar9 = duckdb_je_ctl_bymibname
                    (ptVar18,(size_t *)appsStack_160,3,"nregs",asStack_1b8 + 2,&fStack_17c,
                     &sStack_178,(void *)0x0,0);
  if (iVar9 != 0) goto LAB_01210327;
  emitter_json_kv(peStack_198,"nregs",emitter_type_uint32,&fStack_17c);
  asStack_1b8[2] = 7;
  sStack_178 = 8;
  ptVar18 = ptVar17;
  if ((ptVar17->state).repr != '\0') {
    ptVar18 = duckdb_je_tsd_fetch_slow(ptVar17,false);
  }
  iVar9 = duckdb_je_ctl_bymibname
                    (ptVar18,(size_t *)appsStack_160,3,"slab_size",asStack_1b8 + 2,auStack_1e0,
                     &sStack_178,(void *)0x0,0);
  if (iVar9 != 0) goto LAB_01210327;
  emitter_json_kv(peStack_198,"slab_size",emitter_type_size,auStack_1e0);
  asStack_1b8[2] = 7;
  sStack_178 = 4;
  ptVar18 = ptVar17;
  if ((ptVar17->state).repr != '\0') {
    ptVar18 = duckdb_je_tsd_fetch_slow(ptVar17,false);
  }
  iVar9 = duckdb_je_ctl_bymibname
                    (ptVar18,(size_t *)appsStack_160,3,"nshards",asStack_1b8 + 2,&fStack_17c,
                     &sStack_178,(void *)0x0,0);
  peVar6 = peStack_198;
  if (iVar9 != 0) goto LAB_01210327;
  emitter_json_kv(peStack_198,"nshards",emitter_type_uint32,&fStack_17c);
  emitter_json_object_end(peVar6);
  uVar27 = uStack_f8 + 1;
  goto LAB_0120ff00;
LAB_01210327:
  pcVar16 = "<jemalloc>: Failure in ctl_bymibname()\n";
LAB_0121032e:
  duckdb_je_malloc_write(pcVar16);
  abort();
LAB_0121015b:
  emitter_json_array_end(peStack_198);
LAB_01210168:
  appsStack_160[0] = (size_t **)0x4;
  iVar9 = duckdb_je_mallctl("arenas.nlextents",&uStack_170,(size_t *)appsStack_160,(void *)0x0,0);
  if (iVar9 != 0) {
    pcVar16 = "arenas.nlextents";
LAB_012104b9:
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",pcVar16);
    abort();
  }
  emitter_kv((emitter_t *)str,"nlextents","Number of large size classes",emitter_type_unsigned,
             &uStack_170);
  if (((emitter_t *)str)->output < emitter_output_table) {
    emitter_json_array_kv_begin((emitter_t *)str,"lextent");
    asStack_1b8[2] = 7;
    ptVar17 = (tsd_t *)__tls_get_addr(&PTR_027f6ac0);
    ptVar18 = ptVar17;
    if ((ptVar17->state).repr != '\0') {
      ptVar18 = duckdb_je_tsd_fetch_slow(ptVar17,false);
    }
    iVar9 = duckdb_je_ctl_mibnametomib
                      (ptVar18,(size_t *)appsStack_160,0,"arenas.lextent",asStack_1b8 + 2);
    peVar6 = peStack_198;
    if (iVar9 != 0) {
LAB_0121049f:
      pcVar16 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
      goto LAB_0121032e;
    }
    for (uVar27 = 0; str = (char *)peStack_198, uVar27 < uStack_170; uVar27 = uVar27 + 1) {
      uStack_150 = uVar27;
      emitter_json_object_begin(peStack_198);
      asStack_1b8[2] = 7;
      sStack_178 = 8;
      ptVar18 = ptVar17;
      if ((ptVar17->state).repr != '\0') {
        ptVar18 = duckdb_je_tsd_fetch_slow(ptVar17,false);
      }
      iVar9 = duckdb_je_ctl_bymibname
                        (ptVar18,(size_t *)appsStack_160,3,"size",asStack_1b8 + 2,auStack_1e0,
                         &sStack_178,(void *)0x0,0);
      if (iVar9 != 0) goto LAB_01210327;
      emitter_json_kv(peVar6,"size",emitter_type_size,auStack_1e0);
      emitter_json_object_end(peVar6);
    }
    emitter_json_array_end(peStack_198);
  }
  emitter_json_object_end((emitter_t *)str);
  return extraout_RAX;
}

Assistant:

JEMALLOC_COLD
size_t
malloc_vsnprintf(char *str, size_t size, const char *format, va_list ap) {
	size_t i;
	const char *f;

#define APPEND_C(c) do {						\
	if (i < size) {							\
		str[i] = (c);						\
	}								\
	i++;								\
} while (0)
#define APPEND_S(s, slen) do {						\
	if (i < size) {							\
		size_t cpylen = (slen <= size - i) ? slen : size - i;	\
		memcpy(&str[i], s, cpylen);				\
	}								\
	i += slen;							\
} while (0)
#define APPEND_PADDED_S(s, slen, width, left_justify) do {		\
	/* Left padding. */						\
	size_t pad_len = (width == -1) ? 0 : ((slen < (size_t)width) ?	\
	    (size_t)width - slen : 0);					\
	if (!left_justify && pad_len != 0) {				\
		size_t j;						\
		for (j = 0; j < pad_len; j++) {				\
			if (pad_zero) {					\
				APPEND_C('0');				\
			} else {					\
				APPEND_C(' ');				\
			}						\
		}							\
	}								\
	/* Value. */							\
	APPEND_S(s, slen);						\
	/* Right padding. */						\
	if (left_justify && pad_len != 0) {				\
		size_t j;						\
		for (j = 0; j < pad_len; j++) {				\
			APPEND_C(' ');					\
		}							\
	}								\
}